

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_bitcode_parser.cpp
# Opt level: O0

bool __thiscall dxil_spv::LLVMBCParser::parse(LLVMBCParser *this,void *data,size_t size)

{
  pointer pIVar1;
  Module *pMVar2;
  size_t size_local;
  void *data_local;
  LLVMBCParser *this_local;
  
  pIVar1 = std::
           unique_ptr<dxil_spv::LLVMBCParser::Impl,_std::default_delete<dxil_spv::LLVMBCParser::Impl>_>
           ::operator->(&this->impl);
  pMVar2 = LLVMBC::parseIR(&pIVar1->context,data,size);
  pIVar1 = std::
           unique_ptr<dxil_spv::LLVMBCParser::Impl,_std::default_delete<dxil_spv::LLVMBCParser::Impl>_>
           ::operator->(&this->impl);
  pIVar1->module = pMVar2;
  pIVar1 = std::
           unique_ptr<dxil_spv::LLVMBCParser::Impl,_std::default_delete<dxil_spv::LLVMBCParser::Impl>_>
           ::operator->(&this->impl);
  return pIVar1->module != (Module *)0x0;
}

Assistant:

bool LLVMBCParser::parse(const void *data, size_t size)
{
#ifdef HAVE_LLVMBC
	impl->module = llvm::parseIR(impl->context, data, size);
	if (!impl->module)
		return false;
#else
	auto memory = llvm::WritableMemoryBuffer::getNewUninitMemBuffer(size);
	memcpy(memory->getBufferStart(), data, size);

	llvm::SMDiagnostic error;
	impl->module = llvm::parseIR(*memory, error, impl->context);
	if (!impl->module)
	{
		error.print("DXIL", llvm::errs());
		return false;
	}
#endif

	return true;
}